

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase47::run(TestCase47 *this)

{
  Reader reader;
  Builder builder_00;
  Reader reader_00;
  SegmentBuilder *pSVar1;
  Builder root;
  MallocMessageBuilder builder;
  SegmentBuilder *local_1a8;
  StructBuilder SStack_1a0;
  SegmentBuilder *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  Builder local_140;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_140,&local_108.super_MessageBuilder);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_1a8,
             (EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  initDynamicTestMessage((Builder)builder.super_MessageBuilder.arenaSpace._56_48_);
  pSVar1 = local_1a8;
  StructBuilder::asReader(&SStack_1a0);
  local_140.builder.segment = pSVar1;
  Schema::requireUsableAs((Schema *)&local_140,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  reader._reader.capTable = (CapTableReader *)local_140.builder.pointer;
  reader._reader.segment = (SegmentReader *)local_140.builder.capTable;
  reader._reader.data = (void *)local_128;
  reader._reader.pointers = (WirePointer *)uStack_120;
  reader._reader.dataSize = (undefined4)local_118;
  reader._reader.pointerCount = local_118._4_2_;
  reader._reader._38_2_ = local_118._6_2_;
  reader._reader._40_8_ = uStack_110;
  checkTestMessage(reader);
  pSVar1 = local_1a8;
  StructBuilder::asReader(&SStack_1a0);
  local_178 = pSVar1;
  reader_00.reader.segment = (SegmentReader *)uStack_170;
  reader_00.schema.super_Schema.raw = (Schema)(Schema)pSVar1;
  reader_00.reader.capTable = (CapTableReader *)local_168;
  reader_00.reader.data = (void *)uStack_160;
  reader_00.reader.pointers = (WirePointer *)local_158;
  reader_00.reader.dataSize = (undefined4)uStack_150;
  reader_00.reader.pointerCount = uStack_150._4_2_;
  reader_00.reader._38_2_ = uStack_150._6_2_;
  reader_00.reader._40_8_ = local_148;
  checkDynamicTestMessage(reader_00);
  builder_00.builder.segment = SStack_1a0.segment;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)local_1a8;
  builder_00.builder.capTable = SStack_1a0.capTable;
  builder_00.builder.data = SStack_1a0.data;
  builder_00.builder.pointers = SStack_1a0.pointers;
  builder_00.builder.dataSize = SStack_1a0.dataSize;
  builder_00.builder.pointerCount = SStack_1a0.pointerCount;
  builder_00.builder._38_2_ = SStack_1a0._38_2_;
  checkDynamicTestMessage(builder_00);
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(DynamicApi, Build) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  initDynamicTestMessage(root);
  checkTestMessage(root.asReader().as<TestAllTypes>());

  checkDynamicTestMessage(root.asReader());
  checkDynamicTestMessage(root);
}